

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

CanonicalDataSource __thiscall
polyscope::render::ManagedBuffer<int>::currentCanonicalDataSource(ManagedBuffer<int> *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *__rhs;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  CanonicalDataSource local_4;
  
  if ((in_RDI[3]._M_string_length & 1) == 0) {
    message = in_RDI;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI[3].field_2._M_local_buf)
    ;
    if ((!bVar1) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 4)), !bVar1)) {
      if (((byte)in_RDI[2]._M_dataplus & 1) != 0) {
        return NeedsCompute;
      }
      __rhs = local_50;
      std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::operator+(in_RDI,(char *)__rhs);
      exception(message);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
      std::__cxx11::string::~string(local_50);
      return HostData;
    }
    local_4 = RenderBuffer;
  }
  else {
    local_4 = HostData;
  }
  return local_4;
}

Assistant:

typename ManagedBuffer<T>::CanonicalDataSource ManagedBuffer<T>::currentCanonicalDataSource() {

  // Always prefer the host data if it is up to date
  if (hostBufferIsPopulated) {
    return CanonicalDataSource::HostData;
  }

  // Check if the render buffer contains the canonical data
  if (renderAttributeBuffer || renderTextureBuffer) {
    return CanonicalDataSource::RenderBuffer;
  }

  if (dataGetsComputed) {
    return CanonicalDataSource::NeedsCompute;
  }

  // error! should always be one of the above
  exception("ManagedBuffer " + name +
            " does not have a data in either host or device buffers, nor a compute function.");
  return CanonicalDataSource::HostData; // dummy return
}